

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O0

char * get_top_domain(char *domain,size_t *outlen)

{
  void *pvVar1;
  char *local_38;
  char *last;
  char *first;
  size_t len;
  size_t *outlen_local;
  char *domain_local;
  
  first = (char *)0x0;
  last = (char *)0x0;
  if (domain != (char *)0x0) {
    first = (char *)strlen(domain);
    pvVar1 = memrchr(domain,0x2e,(size_t)first);
    if ((pvVar1 != (void *)0x0) &&
       (last = (char *)memrchr(domain,0x2e,(long)pvVar1 - (long)domain), last != (char *)0x0)) {
      last = last + 1;
      first = first + -((long)last - (long)domain);
    }
  }
  if (outlen != (size_t *)0x0) {
    *outlen = (size_t)first;
  }
  local_38 = domain;
  if (last != (char *)0x0) {
    local_38 = last;
  }
  return local_38;
}

Assistant:

static const char *get_top_domain(const char * const domain, size_t *outlen)
{
  size_t len = 0;
  const char *first = NULL, *last;

  if(domain) {
    len = strlen(domain);
    last = memrchr(domain, '.', len);
    if(last) {
      first = memrchr(domain, '.', (last - domain));
      if(first)
        len -= (++first - domain);
    }
  }

  if(outlen)
    *outlen = len;

  return first ? first : domain;
}